

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O1

bool __thiscall
Ray::cast(Ray *this,Color *c,
         vector<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_> *objects,
         vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *lights)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Obj *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Color c_00;
  int iVar5;
  undefined4 extraout_var;
  Material *this_03;
  pointer psVar7;
  pointer psVar8;
  bool bVar9;
  Color diffuseColor;
  Color local_84;
  Ray *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Obj *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  Ray *local_60;
  Color *local_58;
  vector<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_> *local_50;
  vec4 *local_48;
  pointer local_40;
  pointer local_38;
  undefined8 *puVar6;
  
  psVar7 = (objects->
           super__Vector_base<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  local_40 = (objects->
             super__Vector_base<std::shared_ptr<Obj>,_std::allocator<std::shared_ptr<Obj>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 == local_40) {
    bVar9 = false;
  }
  else {
    local_48 = &this->direction;
    bVar9 = false;
    local_60 = this;
    local_58 = c;
    local_50 = lights;
    do {
      this_00 = (psVar7->super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (psVar7->super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_80 = (Ray *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Ray,std::allocator<Ray>,glm::tvec4<float,(glm::precision)0>&,glm::tvec4<float,(glm::precision)0>&>
                (&local_78,&local_80,(allocator<Ray> *)&local_84,&this->start,local_48);
      iVar5 = (*this_00->_vptr_Obj[1])(this_00,&local_80);
      puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar5);
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
      }
      if (puVar6 != (undefined8 *)0x0) {
        local_38 = psVar7;
        this_03 = Obj::getMaterial(this_00);
        local_84 = Material::getColor(this_03);
        psVar3 = (local_50->
                 super__Vector_base<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (psVar8 = (local_50->
                      super__Vector_base<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar3;
            psVar8 = psVar8 + 1) {
          peVar4 = (psVar8->super___shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_02 = (psVar8->super___shared_ptr<Light,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                    _M_pi;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = this_02->_M_use_count + 1;
            }
          }
          uVar2 = *puVar6;
          uVar1 = *(undefined4 *)(puVar6 + 1);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          local_70 = this_00;
          local_68 = this_01;
          iVar5 = (**peVar4->_vptr_Light)(uVar2,uVar1,peVar4,&local_70);
          c_00 = Color::operator*(&local_84,SUB43(iVar5,0));
          Color::operator=(&local_84,c_00);
          if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
          }
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
        }
        Color::operator=(local_58,local_84);
        bVar9 = true;
        psVar7 = local_38;
        this = local_60;
      }
      if (puVar6 != (undefined8 *)0x0) {
        operator_delete(puVar6);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != local_40);
  }
  return bVar9;
}

Assistant:

bool Ray::cast(Color& c, std::vector<std::shared_ptr<Obj>> objects, std::vector<std::shared_ptr<Light>> lights) {
    bool intersected = false;
    for( auto e : objects) {
        glm::vec3* hitpoint = e->intersect(std::make_shared<Ray>(start, direction));
        if (hitpoint != nullptr) {
            //c = e->getMaterial().getColor();
            Color diffuseColor =  e->getMaterial().getColor();
            for(auto light : lights){
                diffuseColor = diffuseColor * light->diffuse(*hitpoint, e);
            }
            c =  diffuseColor;
            intersected = true;
        }
        delete hitpoint;
    }
    return intersected;
}